

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O2

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunSpeedTest(AV1CornerMatchTest *this)

{
  ParamType *pPVar1;
  ulong uVar2;
  ulong uVar3;
  SEARCH_METHODS *pSVar4;
  int iVar5;
  bool bVar6;
  double c_one_over_stddev1;
  double c_mean2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input1;
  double c_mean1;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  double c_one_over_stddev2;
  int64_t local_98;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  
  input1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(0x100,(nothrow_t *)&std::nothrow);
  input2._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(0x100,(nothrow_t *)&std::nothrow);
  c_one_over_stddev1 = 0.0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&c_mean1,"input1","nullptr",&input1,(void **)&c_one_over_stddev1);
  if (c_mean1._0_1_ == '\0') {
    testing::Message::Message((Message *)&c_one_over_stddev1);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)
                local_a8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_mean2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x94,(char *)pSVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_mean2,(Message *)&c_one_over_stddev1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_mean2);
    if (c_one_over_stddev1 != 0.0) {
      (**(code **)(*(long *)c_one_over_stddev1 + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
    c_one_over_stddev1 = 0.0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              ((internal *)&c_mean1,"input2","nullptr",&input2,(void **)&c_one_over_stddev1);
    if (c_mean1._0_1_ != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
      pPVar1 = testing::
               WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
               ::GetParam();
      GenerateInput(this,(uint8_t *)
                         input1._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                    (uint8_t *)
                    input2._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0x10,
                    (pPVar1->
                    super__Tuple_impl<0UL,_int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                    ).super__Head_base<0UL,_int,_false>._M_head_impl);
      ::aom_usec_timer_start(&ref_timer);
      iVar5 = 1000000;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        aom_compute_mean_stddev_c
                  ((uchar *)input1._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   &c_mean1,&c_one_over_stddev1);
        aom_compute_mean_stddev_c
                  ((uchar *)input2._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   &c_mean2,&c_one_over_stddev2);
      }
      ::aom_usec_timer_mark(&ref_timer);
      local_98 = ::aom_usec_timer_elapsed(&ref_timer);
      ::aom_usec_timer_start(&test_timer);
      iVar5 = 1000000;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        (*this->target_compute_mean_stddev_func)
                  ((uchar *)input1._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   &simd_mean1,&simd_one_over_stddev1);
        (*this->target_compute_mean_stddev_func)
                  ((uchar *)input2._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   &simd_mean2,&simd_one_over_stddev2);
      }
      ::aom_usec_timer_mark(&test_timer);
      uVar2 = ::aom_usec_timer_elapsed(&test_timer);
      printf("aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)(int)local_98 / (double)(int)uVar2,local_98,uVar2 & 0xffffffff);
      ::aom_usec_timer_start(&ref_timer);
      iVar5 = 1000000;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        aom_compute_correlation_c
                  ((uchar *)input1._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   (double)CONCAT71(c_mean1._1_7_,c_mean1._0_1_),c_one_over_stddev1,
                   (uchar *)input2._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   c_mean2,c_one_over_stddev2);
      }
      ::aom_usec_timer_mark(&ref_timer);
      uVar2 = ::aom_usec_timer_elapsed(&ref_timer);
      ::aom_usec_timer_start(&test_timer);
      iVar5 = 1000000;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        (*this->target_compute_corr_func)
                  ((uchar *)input1._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   (double)CONCAT71(c_mean1._1_7_,c_mean1._0_1_),c_one_over_stddev1,
                   (uchar *)input2._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x10,0,0,
                   c_mean2,c_one_over_stddev2);
      }
      ::aom_usec_timer_mark(&test_timer);
      uVar3 = ::aom_usec_timer_elapsed(&test_timer);
      printf("aom_compute_correlation(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)(int)uVar2 / (double)(int)uVar3,uVar2 & 0xffffffff,uVar3 & 0xffffffff);
      goto LAB_003e97a0;
    }
    testing::Message::Message((Message *)&c_one_over_stddev1);
    if (local_a8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
        (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)
                local_a8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_mean2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x95,(char *)pSVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_mean2,(Message *)&c_one_over_stddev1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_mean2);
    if (c_one_over_stddev1 != 0.0) {
      (**(code **)(*(long *)c_one_over_stddev1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
LAB_003e97a0:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&input2);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&input1);
  return;
}

Assistant:

void AV1CornerMatchTest::RunSpeedTest() {
  const int w = 16, h = 16;
  const int num_iters = 1000000;
  aom_usec_timer ref_timer, test_timer;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  // Time aom_compute_mean_stddev()
  double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_mean_stddev_c(input1.get(), w, 0, 0, &c_mean1,
                              &c_one_over_stddev1);
    aom_compute_mean_stddev_c(input2.get(), w, 0, 0, &c_mean2,
                              &c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  int elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_mean_stddev_func(input1.get(), w, 0, 0, &simd_mean1,
                                    &simd_one_over_stddev1);
    target_compute_mean_stddev_func(input2.get(), w, 0, 0, &simd_mean2,
                                    &simd_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  int elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));

  // Time aom_compute_correlation
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_correlation_c(input1.get(), w, 0, 0, c_mean1,
                              c_one_over_stddev1, input2.get(), w, 0, 0,
                              c_mean2, c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_corr_func(input1.get(), w, 0, 0, c_mean1, c_one_over_stddev1,
                             input2.get(), w, 0, 0, c_mean2,
                             c_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_correlation(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));
}